

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateManager.cpp
# Opt level: O2

void __thiscall
TemplateManager::GetTemplates
          (TemplateManager *this,TYPE_ID s,KEY_ID p,TYPE_ID o,unsigned_short scope,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *tripleTmpl)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  iterator iVar5;
  undefined2 in_register_00000082;
  _Self __tmp;
  _Self __tmp_1;
  key_type local_78;
  _Rb_tree_node_base *local_58;
  _Self __tmp_2;
  TYPE_ID local_44;
  _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Stack_40;
  TYPE_ID s_local;
  undefined4 local_34;
  
  local_34 = CONCAT22(in_register_00000082,scope);
  local_78.ID = 0;
  local_78.subjectType = s;
  local_78.predicateID = p;
  local_78.objectType = o;
  local_78.scope = scope;
  local_44 = s;
  p_Stack_40 = (_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)tripleTmpl;
  if (((p == 0xffffffffffffffff) || (s == 0xffffffff)) || (o == 0xffffffff)) {
    __tmp_2._M_node = &(this->templates)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (local_58 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_58 != __tmp_2._M_node;
        local_58 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_58)) {
      p_Var3 = local_58 + 1;
      for (p_Var4 = *(_Rb_tree_node_base **)(local_58 + 2);
          p_Var4 != (_Rb_tree_node_base *)&p_Var3->_M_left;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        if ((((*(TYPE_ID *)&p_Var4[1]._M_parent == s || s == 0xffffffff) &&
             ((o == 0xffffffff || (*(TYPE_ID *)&p_Var4[1]._M_right == o)))) &&
            ((p == 0xffffffffffffffff || (p_Var4[1]._M_left == (_Base_ptr)p)))) &&
           (*(short *)((long)&p_Var4[1]._M_right + 4) == (short)local_34)) {
          std::__detail::
          _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert(p_Stack_40,(value_type *)(p_Var4 + 1));
        }
      }
    }
  }
  else {
    p_Var1 = &(this->templates)._M_t._M_impl.super__Rb_tree_header;
    if (scope == 0) {
      iVar5 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<TripleTemplate,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>_>_>_>
              ::find(&(this->templates)._M_t,&local_44);
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        iVar2 = std::
                _Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                ::find((_Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                        *)&iVar5._M_node[1]._M_parent,&local_78);
        if (iVar2._M_node != (_Base_ptr)&iVar5._M_node[1]._M_left) {
          std::__detail::
          _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert(p_Stack_40,(value_type *)(iVar2._M_node + 1));
        }
      }
    }
    else {
      for (p_Var3 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3))
      {
        iVar2 = std::
                _Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                ::find((_Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                        *)&p_Var3[1]._M_parent,&local_78);
        if (iVar2._M_node != (_Base_ptr)&p_Var3[1]._M_left) {
          std::__detail::
          _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert(p_Stack_40,(value_type *)(iVar2._M_node + 1));
        }
      }
    }
  }
  return;
}

Assistant:

void TemplateManager::GetTemplates(TYPE_ID s, KEY_ID p, TYPE_ID o, unsigned short int scope, unordered_set<size_t>* tripleTmpl) {

	map<TYPE_ID, set<TripleTemplate> >::iterator it_templates;
	set<TripleTemplate>::iterator it_triple;

	TripleTemplate tmp;
	tmp.subjectType = s;
	tmp.predicateID = p;
	tmp.objectType = o;
	tmp.scope = scope;

	if (s != (TYPE_ID) -1 and o != (TYPE_ID) -1 and p != (KEY_ID) -1) { //FIXME, this is kinda hack, should find better way for wildcards
		if (scope == 0 and s != (TYPE_ID) -1) {
			it_templates = templates.find(s);
			if (it_templates != templates.end()) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		} else {
			for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}
	} else {
		//FIXME this is a "slow" hack, find a "normal" solution to work with wildcards
//		cerr << "nie jest zle\ts:" << s << "\to: " << o << endl;
		for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
			for (it_triple = it_templates->second.begin(); it_triple != it_templates->second.end(); it_triple++) {
				if ((it_triple->subjectType == s or s == (TYPE_ID) -1) and (it_triple->objectType == o or o == (TYPE_ID) -1) and (it_triple->predicateID == p or p == (KEY_ID) -1)
						and it_triple->scope == scope) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}

	}

}